

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::ShoutyToPascalCase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view input)

{
  uchar c;
  bool bVar1;
  char cVar2;
  size_type sVar3;
  uchar *puVar4;
  int local_28;
  uchar local_22;
  char current;
  int i;
  char previous;
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  _i = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_22 = '_';
  for (local_28 = 0;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&i),
      (ulong)(long)local_28 < sVar3; local_28 = local_28 + 1) {
    puVar4 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                                 (long)local_28);
    c = *puVar4;
    bVar1 = absl::lts_20250127::ascii_isalnum(c);
    if (bVar1) {
      bVar1 = absl::lts_20250127::ascii_isalnum(local_22);
      if (bVar1) {
        bVar1 = absl::lts_20250127::ascii_isdigit(local_22);
        if (bVar1) {
          cVar2 = absl::lts_20250127::ascii_toupper(c);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
        }
        else {
          bVar1 = absl::lts_20250127::ascii_islower(local_22);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,c);
          }
          else {
            cVar2 = absl::lts_20250127::ascii_tolower(c);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
          }
        }
      }
      else {
        cVar2 = absl::lts_20250127::ascii_toupper(c);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      }
    }
    local_22 = c;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ShoutyToPascalCase(absl::string_view input) {
  std::string result;
  // Simple way of implementing "always start with upper"
  char previous = '_';
  for (int i = 0; i < input.size(); i++) {
    char current = input[i];
    if (!absl::ascii_isalnum(current)) {
      previous = current;
      continue;
    }
    if (!absl::ascii_isalnum(previous)) {
      result += absl::ascii_toupper(current);
    } else if (absl::ascii_isdigit(previous)) {
      result += absl::ascii_toupper(current);
    } else if (absl::ascii_islower(previous)) {
      result += current;
    } else {
      result += absl::ascii_tolower(current);
    }
    previous = current;
  }
  return result;
}